

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O0

int mpt_type_add(mpt_type_traits *traits)

{
  byte bVar1;
  generic_traits_chunk *local_30;
  generic_traits_chunk *next;
  generic_traits_chunk *pgStack_20;
  int pos;
  generic_traits_chunk *curr;
  mpt_type_traits *traits_local;
  
  next._4_4_ = 0x900;
  if ((traits == (mpt_type_traits *)0x0) || (traits->size == 0)) {
    traits_local._4_4_ = -1;
  }
  else {
    pgStack_20 = generic_types;
    if (generic_types == (generic_traits_chunk *)0x0) {
      pgStack_20 = (generic_traits_chunk *)malloc(0x100);
      if (pgStack_20 == (generic_traits_chunk *)0x0) {
        return -4;
      }
      pgStack_20->next = (generic_traits_chunk *)0x0;
      pgStack_20->used = '\0';
      generic_types = pgStack_20;
      atexit(_generic_types_fini);
    }
    while (pgStack_20->used == '\x1e') {
      next._4_4_ = next._4_4_ + 0x1e;
      local_30 = pgStack_20->next;
      if (local_30 == (generic_traits_chunk *)0x0) {
        if (0xfff < next._4_4_) {
          return -3;
        }
        local_30 = (generic_traits_chunk *)malloc(0x100);
        if (local_30 == (generic_traits_chunk *)0x0) {
          return -4;
        }
        local_30->next = (generic_traits_chunk *)0x0;
        local_30->used = '\0';
        pgStack_20->next = local_30;
      }
      pgStack_20 = local_30;
    }
    traits_local._4_4_ = (uint)pgStack_20->used + next._4_4_;
    if (traits_local._4_4_ < 0x1000) {
      bVar1 = pgStack_20->used;
      pgStack_20->used = bVar1 + 1;
      pgStack_20->traits[bVar1] = traits;
    }
    else {
      traits_local._4_4_ = -3;
    }
  }
  return traits_local._4_4_;
}

Assistant:

extern int mpt_type_add(const MPT_STRUCT(type_traits) *traits)
{
	struct generic_traits_chunk *curr;
	int pos = MPT_ENUM(_TypeValueAdd);
	
	/* must have valid size */
	if (!traits || !traits->size) {
		return MPT_ERROR(BadArgument);
	}
	/* create initial traits chunk */
	if (!(curr = generic_types)) {
		if (!(curr = malloc(sizeof(*generic_types)))) {
			return MPT_ERROR(BadOperation);
		}
		curr->next = 0;
		curr->used = 0;
		generic_types = curr;
		atexit(_generic_types_fini);
	}
	/* find available traits chunk entry */
	while (curr->used == MPT_arrsize(curr->traits)) {
		struct generic_traits_chunk *next;
		pos += MPT_arrsize(curr->traits);
		/* append new empty chunk */
		if (!(next = curr->next)) {
			if (pos > MPT_ENUM(_TypeValueMax)) {
				return MPT_ERROR(BadType);
			}
			if (!(next = malloc(sizeof(*next)))) {
				return MPT_ERROR(BadOperation);
			}
			next->next = 0;
			next->used = 0;
			curr->next = next;
		}
		curr = next;
	}
	pos += curr->used;
	if (pos > MPT_ENUM(_TypeValueMax)) {
		return MPT_ERROR(BadType);
	}
	curr->traits[curr->used++] = traits;
	return pos;
}